

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O1

void PrintUsage(char *argv0)

{
  fprintf(_stderr,"Usage: %s [arg] [arg] [arg] ...\n",argv0);
  fwrite("Where \'arg\' is one of:\n",0x17,1,_stderr);
  fwrite("\t-delay <seconds>\n",0x12,1,_stderr);
  fwrite("\t-width <pixels>\n",0x11,1,_stderr);
  fwrite("\t-height <pixels>\n",0x12,1,_stderr);
  fwrite("\t-bpp <bits>\n",0xd,1,_stderr);
  fwrite("\t-format <fmt> (one of the: YV12, IYUV, YUY2, UYVY, YVYU)\n",0x3a,1,_stderr);
  fwrite("\t-hw\n",5,1,_stderr);
  fwrite("\t-flip\n",7,1,_stderr);
  fprintf(_stderr,"\t-scale (test scaling features, from 50%% upto window size)\n");
  fwrite("\t-mono (use monochromatic RGB2YUV conversion)\n",0x2e,1,_stderr);
  fwrite("\t-lum <perc> (use luminance correction during RGB2YUV conversion,\n",0x42,1,_stderr);
  fprintf(_stderr,"\t             from 0%% to unlimited, normal is 100%%)\n");
  fwrite("\t-help (shows this help)\n",0x19,1,_stderr);
  fwrite("\t-fullscreen (test overlay in fullscreen mode)\n",0x2f,1,_stderr);
  return;
}

Assistant:

static void PrintUsage(char *argv0)
{
	fprintf(stderr, "Usage: %s [arg] [arg] [arg] ...\n", argv0);
	fprintf(stderr, "Where 'arg' is one of:\n");
	fprintf(stderr, "	-delay <seconds>\n");
	fprintf(stderr, "	-width <pixels>\n");
	fprintf(stderr, "	-height <pixels>\n");
	fprintf(stderr, "	-bpp <bits>\n");
	fprintf(stderr, "	-format <fmt> (one of the: YV12, IYUV, YUY2, UYVY, YVYU)\n");
	fprintf(stderr, "	-hw\n");
	fprintf(stderr, "	-flip\n");
	fprintf(stderr, "	-scale (test scaling features, from 50%% upto window size)\n");
	fprintf(stderr, "	-mono (use monochromatic RGB2YUV conversion)\n");
	fprintf(stderr, "	-lum <perc> (use luminance correction during RGB2YUV conversion,\n");
	fprintf(stderr, "	             from 0%% to unlimited, normal is 100%%)\n");
	fprintf(stderr, "	-help (shows this help)\n");
	fprintf(stderr, "	-fullscreen (test overlay in fullscreen mode)\n");
}